

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

size_t units::findOperatorSep(string *ustring,string *operators)

{
  char cVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined4 uStack_28;
  int index;
  
  _uStack_28 = in_RAX;
  std::__cxx11::string::append((char *)operators);
  uVar2 = std::__cxx11::string::find_last_of((string *)ustring,(ulong)operators);
  while (uVar2 - 1 < 0xfffffffffffffffe) {
    cVar1 = (ustring->_M_dataplus)._M_p[uVar2];
    if (((cVar1 != ')') && (cVar1 != '}')) && (cVar1 != ']')) break;
    _uStack_28 = CONCAT44((int)uVar2 + -1,uStack_28);
    cVar1 = getMatchCharacter(cVar1);
    segmentcheckReverse(ustring,cVar1,&index);
    uVar2 = 0xffffffffffffffff;
    if (0 < index) {
      uVar2 = std::__cxx11::string::find_last_of((string *)ustring,(ulong)operators);
    }
  }
  return -(ulong)(uVar2 == 0) | uVar2;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}